

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

Var __thiscall
Js::JavascriptProxy::GetTypeOfString(JavascriptProxy *this,ScriptContext *requestContext)

{
  RecyclableObject *pRVar1;
  bool bVar2;
  int iVar3;
  JavascriptProxy *pJVar4;
  JavascriptString *pJVar5;
  undefined4 extraout_var;
  
  pJVar4 = UnwrapNestedProxies(this);
  if ((pJVar4->handler).ptr == (RecyclableObject *)0x0) {
    pJVar5 = StringCache::GetObjectTypeDisplay
                       (&((requestContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    return pJVar5;
  }
  bVar2 = VarIs<Js::JavascriptFunction>((this->target).ptr);
  if (bVar2) {
    pJVar5 = StringCache::GetFunctionTypeDisplay
                       (&((requestContext->super_ScriptContextBase).javascriptLibrary)->stringCache)
    ;
    return pJVar5;
  }
  pRVar1 = (pJVar4->target).ptr;
  iVar3 = (*(pRVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x53])(pRVar1,requestContext);
  return (Var)CONCAT44(extraout_var,iVar3);
}

Assistant:

Var JavascriptProxy::GetTypeOfString(ScriptContext* requestContext)
    {
        const JavascriptProxy* proxy = UnwrapNestedProxies(this);

        if (proxy->handler == nullptr)
        {
            // even if handler is nullptr, return typeof as "object"
            return requestContext->GetLibrary()->GetObjectTypeDisplayString();
        }
        // if exotic object has [[Call]] we should return "function", otherwise return "object"
        if (VarIs<JavascriptFunction>(this->target))
        {
            return requestContext->GetLibrary()->GetFunctionTypeDisplayString();
        }
        else
        {
            // handle nested cases recursively
            return proxy->target->GetTypeOfString(requestContext);
        }
    }